

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O1

bool libaom_examples::parse_multilayer_file(char *metadata_path,MultilayerMetadata *multilayer)

{
  pointer *ppLVar1;
  ushort uVar2;
  MultilayerUseCase MVar3;
  uint uVar4;
  pointer pLVar5;
  pointer pLVar6;
  DepthRepresentationElement DVar7;
  DepthRepresentationElement DVar8;
  DepthRepresentationElement DVar9;
  DepthRepresentationElement DVar10;
  pointer pLVar11;
  LayerMetadata *pLVar12;
  Type TVar13;
  char cVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  const_iterator __end2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  int *indent_00;
  ulong uVar23;
  long lVar24;
  DepthRepresentationElement *indent_01;
  int64_t iVar25;
  bool *max;
  undefined8 uVar26;
  ulong uVar27;
  string *psVar28;
  int64_t min;
  bool *pbVar29;
  char *pcVar30;
  iterator __position;
  libaom_examples *this;
  uint8_t *puVar31;
  uint8_t *puVar32;
  uint16_t *puVar33;
  undefined8 uVar34;
  pointer pLVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  ulong uVar38;
  ulong uVar39;
  byte bVar40;
  byte bVar41;
  undefined8 uVar42;
  int line_idx;
  bool syntax_error_1;
  bool local_394;
  bool syntax_error;
  bool has_list_prefix_1;
  bool has_list_prefix_2;
  ParsedValue value_2;
  DepthRepresentationElement el;
  int indent_1;
  int indent_2;
  bool has_list_prefix;
  bool *local_358;
  int indent;
  uint16_t *local_348;
  uint16_t *local_340;
  uint8_t *local_338;
  bool *local_330;
  uint8_t *local_328;
  ParsedValue value_1;
  string field_name_2;
  bool bStack_2e0;
  uint8_t uStack_2df;
  uint8_t uStack_2de;
  bool bStack_2dd;
  string field_name_1;
  string field_name;
  ParsedValue value;
  ifstream file;
  
  bVar41 = 0;
  std::ifstream::ifstream(&file,metadata_path,_S_in);
  cVar14 = std::__basic_file<char>::is_open();
  if (cVar14 == '\0') {
    bVar16 = false;
    fprintf(_stderr,"Error: Failed to open %s\n",metadata_path);
  }
  else {
    line_idx = 0;
    indent = -1;
    field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
    field_name._M_string_length = 0;
    field_name.field_2._M_local_buf[0] = '\0';
    value.type_ = kNone;
    value.int_value_ = 0;
    value.double_value_ = 0.0;
    multilayer->use_case = MULTILAYER_USE_CASE_UNSPECIFIED;
    pLVar5 = (multilayer->layers).
             super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (multilayer->layers).
    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (multilayer->layers).
    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (multilayer->layers).
    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (pLVar5 != (pointer)0x0) {
      operator_delete(pLVar5);
    }
    do {
      while( true ) {
        bVar15 = anon_unknown_0::parse_line
                           (&file,0,false,&indent,&has_list_prefix,&line_idx,&field_name,&value,
                            &local_394);
        if (!bVar15) {
          bVar41 = local_394 ^ 1;
          goto LAB_0084ca1c;
        }
        iVar18 = std::__cxx11::string::compare((char *)&field_name);
        if (iVar18 != 0) break;
        if (value.type_ != kInteger) {
          if (value.type_ == kFloatingPoint) {
            pcVar30 = "Floating point value found where integer was expected at line %d\n";
          }
          else {
            pcVar30 = "No value found where integer was expected at line %d\n";
          }
          bVar41 = 0;
          fprintf(_stderr,pcVar30,(ulong)(uint)line_idx);
          goto LAB_0084ca1c;
        }
        if (0x3f < (ulong)value.int_value_) {
          bVar41 = 0;
          fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",value.int_value_,
                  0,0x3f);
          goto LAB_0084ca1c;
        }
        multilayer->use_case = (MultilayerUseCase)value.int_value_;
      }
      iVar18 = std::__cxx11::string::compare((char *)&field_name);
      if (iVar18 != 0) {
        bVar41 = 0;
        fprintf(_stderr,"Error: Unknown field %s at line %d\n",field_name._M_dataplus._M_p,
                (ulong)(uint)line_idx);
        goto LAB_0084ca1c;
      }
      iVar18 = indent + 1;
      indent_1 = -1;
      field_name_1._M_dataplus._M_p = (pointer)&field_name_1.field_2;
      field_name_1._M_string_length = 0;
      field_name_1.field_2._M_local_buf[0] = '\0';
      value_1.type_ = kNone;
      value_1.int_value_ = 0;
      value_1.double_value_ = 0.0;
      local_358 = (bool *)((ulong)local_358 & 0xffffffff00000000);
      bVar15 = false;
      do {
        indent_00 = &indent_1;
        pbVar29 = &has_list_prefix_1;
        bVar16 = anon_unknown_0::parse_line
                           (&file,iVar18,true,indent_00,pbVar29,&line_idx,&field_name_1,&value_1,
                            &syntax_error);
        iVar20 = (int)indent_00;
        if (!bVar16) {
          if (syntax_error == false) {
            anon_unknown_0::validate_layer
                      ((multilayer->layers).
                       super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1,(bool)((byte)local_358 & 1),
                       bVar15);
            bVar15 = true;
            goto LAB_0084c9c5;
          }
          break;
        }
        if (has_list_prefix_1 == true) {
          pLVar5 = (multilayer->layers).
                   super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar6 = (multilayer->layers).
                   super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar23 = ((long)pLVar6 - (long)pLVar5 >> 2) * -0x70a3d70a3d70a3d7;
          if (3 < uVar23) {
            parse_multilayer_file((libaom_examples *)&line_idx);
            break;
          }
          if (pLVar5 != pLVar6) {
            anon_unknown_0::validate_layer(pLVar6 + -1,(bool)((byte)local_358 & 1),bVar15);
          }
          iVar20 = (int)uVar23;
          __position._M_current =
               (multilayer->layers).
               super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (((long)__position._M_current -
               (long)(multilayer->layers).
                     super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                     ._M_impl.super__Vector_impl_data._M_start == 100) &&
             (__position._M_current[-1].layer_color_description.second == true)) {
            parse_multilayer_file();
            break;
          }
          field_name_2._M_dataplus._M_p = field_name_2._M_dataplus._M_p & 0xffffff0000000000;
          field_name_2._M_string_length = field_name_2._M_string_length & 0xffff000000000000;
          field_name_2.field_2._M_local_buf[8] = '\0';
          field_name_2.field_2._M_allocated_capacity = 0;
          field_name_2.field_2._12_4_ = ALPHA_STRAIGHT;
          bStack_2e0 = false;
          uStack_2df = '\0';
          uStack_2de = '\0';
          bStack_2dd = false;
          if (__position._M_current ==
              (multilayer->layers).
              super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
            ::_M_realloc_insert<libaom_examples::LayerMetadata>
                      (&multilayer->layers,__position,(LayerMetadata *)&field_name_2);
          }
          else {
            psVar28 = &field_name_2;
            for (lVar24 = 0x19; lVar24 != 0; lVar24 = lVar24 + -1) {
              (__position._M_current)->layer_type = *(LayerType *)&(psVar28->_M_dataplus)._M_p;
              psVar28 = (string *)((long)psVar28 + (ulong)bVar41 * -8 + 4);
              __position._M_current = __position._M_current + (ulong)bVar41 * -8 + 4;
            }
            ppLVar1 = &(multilayer->layers).
                       super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppLVar1 = *ppLVar1 + 1;
            iVar20 = 0;
          }
          local_358 = (bool *)((ulong)local_358 & 0xffffffff00000000);
          bVar15 = false;
        }
        pLVar5 = (multilayer->layers).
                 super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((multilayer->layers).
            super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
            ._M_impl.super__Vector_impl_data._M_start == pLVar5) {
          parse_multilayer_file((libaom_examples *)&line_idx);
          break;
        }
        iVar19 = std::__cxx11::string::compare((char *)&field_name_1);
        if (iVar19 == 0) {
          uVar23 = (ulong)(uint)line_idx;
          if (value_1.type_ != kInteger) {
LAB_0084c35f:
            if (value_1.type_ == kFloatingPoint) {
              pcVar30 = "Floating point value found where integer was expected at line %d\n";
            }
            else {
              pcVar30 = "No value found where integer was expected at line %d\n";
            }
            bVar16 = false;
            fprintf(_stderr,pcVar30,uVar23);
            goto LAB_0084c7fb;
          }
          if (0x1f < (ulong)value_1.int_value_) {
            uVar34 = 0x1f;
LAB_0084c77e:
            bVar16 = false;
            fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",
                    value_1.int_value_,0,uVar34);
            goto LAB_0084c7fb;
          }
          pLVar5[-1].layer_type = (LayerType)value_1.int_value_;
LAB_0084c7f8:
          bVar16 = true;
        }
        else {
          iVar19 = std::__cxx11::string::compare((char *)&field_name_1);
          if (iVar19 == 0) {
            bVar16 = anon_unknown_0::ParsedValue::IntegerValueInRange<bool>
                               (&value_1,(ulong)(uint)line_idx,
                                (int64_t)&pLVar5[-1].luma_plane_only_flag,iVar20,pbVar29);
joined_r0x0084c760:
            if (!bVar16) {
LAB_0084c2b8:
              bVar16 = false;
              goto LAB_0084c7fb;
            }
            goto LAB_0084c7f8;
          }
          iVar20 = std::__cxx11::string::compare((char *)&field_name_1);
          if (iVar20 == 0) {
            uVar23 = (ulong)(uint)line_idx;
            if (value_1.type_ != kInteger) goto LAB_0084c35f;
            if (7 < (ulong)value_1.int_value_) {
              uVar34 = 7;
              goto LAB_0084c77e;
            }
            pLVar5[-1].layer_view_type = (MultilayerViewType)value_1.int_value_;
            goto LAB_0084c7f8;
          }
          iVar20 = std::__cxx11::string::compare((char *)&field_name_1);
          if (iVar20 == 0) {
            puVar32 = &pLVar5[-1].group_id;
            iVar25 = 3;
LAB_0084c313:
            bVar16 = false;
            bVar17 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
                               (&value_1,0,iVar25,line_idx,puVar32);
            if (bVar17) goto LAB_0084c7f8;
          }
          else {
            iVar20 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar20 == 0) {
              puVar32 = &pLVar5[-1].layer_dependency_idc;
              iVar25 = 7;
              goto LAB_0084c313;
            }
            iVar20 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar20 == 0) {
              uVar23 = (ulong)(uint)line_idx;
              if (value_1.type_ != kInteger) goto LAB_0084c35f;
              if (3 < (ulong)value_1.int_value_) {
                uVar34 = 3;
                goto LAB_0084c77e;
              }
              pLVar5[-1].layer_metadata_scope = (MultilayerMetadataScope)value_1.int_value_;
              goto LAB_0084c7f8;
            }
            iVar20 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar20 == 0) {
              bVar16 = anon_unknown_0::parse_color_properties
                                 (&file,indent_1,&line_idx,(ColorProperties *)&field_name_2);
              if (!bVar16) goto LAB_0084c2b8;
              pLVar5[-1].layer_color_description.first = field_name_2._M_dataplus._M_p._0_4_;
              pLVar5[-1].layer_color_description.second = true;
              goto LAB_0084c7f8;
            }
            iVar20 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar20 == 0) {
              iVar20 = indent_1 + 1;
              el.sign_flag = true;
              el.exponent = 0xff;
              el.mantissa_len = 0xff;
              el._3_1_ = 0xff;
              field_name_2._M_dataplus._M_p = (pointer)&field_name_2.field_2;
              field_name_2._M_string_length = 0;
              field_name_2.field_2._M_allocated_capacity =
                   field_name_2.field_2._M_allocated_capacity & 0xffffffffffffff00;
              value_2.type_ = kNone;
              value_2.int_value_ = 0;
              value_2.double_value_ = 0.0;
              local_358 = &pLVar5[-1].global_alpha_info.alpha_simple_flag;
              local_338 = &pLVar5[-1].global_alpha_info.alpha_bit_depth;
              local_328 = &pLVar5[-1].global_alpha_info.alpha_clip_idc;
              local_330 = &pLVar5[-1].global_alpha_info.alpha_incr_flag;
              local_340 = &pLVar5[-1].global_alpha_info.alpha_transparent_value;
              local_348 = &pLVar5[-1].global_alpha_info.alpha_opaque_value;
              pLVar5[-1].global_alpha_info.alpha_color_description.second = false;
              pLVar5[-1].global_alpha_info.alpha_use_idc = ALPHA_STRAIGHT;
              pLVar5[-1].global_alpha_info.alpha_simple_flag = false;
              pLVar5[-1].global_alpha_info.alpha_bit_depth = '\0';
              pLVar5[-1].global_alpha_info.alpha_clip_idc = '\0';
              pLVar5[-1].global_alpha_info.alpha_incr_flag = false;
              pLVar12 = pLVar5 + -1;
              pLVar5[-1].global_alpha_info.alpha_transparent_value = 0;
              pLVar5[-1].global_alpha_info.alpha_opaque_value = 0;
              (pLVar12->global_alpha_info).alpha_color_description.first.color_range = false;
              (pLVar12->global_alpha_info).alpha_color_description.first.color_primaries = '\0';
              (pLVar12->global_alpha_info).alpha_color_description.first.transfer_characteristics =
                   '\0';
              (pLVar12->global_alpha_info).alpha_color_description.first.matrix_coefficients = '\0';
LAB_0084c48b:
              do {
                while( true ) {
                  indent_01 = &el;
                  pbVar29 = &has_list_prefix_2;
                  bVar16 = anon_unknown_0::parse_line
                                     (&file,iVar20,false,(int *)indent_01,pbVar29,&line_idx,
                                      &field_name_2,&value_2,&syntax_error_1);
                  iVar19 = (int)indent_01;
                  if (!bVar16) {
                    if (syntax_error_1 == false) {
                      if (*local_338 != 0) {
                        iVar20 = 2 << (*local_338 & 0x1f);
                        uVar2 = *local_340;
                        if ((int)(uint)uVar2 < iVar20) {
                          uVar2 = *local_348;
                          if ((int)(uint)uVar2 < iVar20) {
                            bVar16 = true;
                            if ((pLVar5[-1].global_alpha_info.alpha_color_description.second != true
                                ) || (pLVar5[-1].global_alpha_info.alpha_use_idc == ALPHA_STRAIGHT))
                            goto LAB_0084c73d;
                            parse_multilayer_file();
                            goto LAB_0084c73a;
                          }
                          pcVar30 = "Error: alpha_opaque_value %d out of range [0, %d]\n";
                        }
                        else {
                          pcVar30 = "Error: alpha_transparent_value %d out of range [0, %d]\n";
                        }
                        bVar16 = false;
                        fprintf(_stderr,pcVar30,(ulong)uVar2,(ulong)(iVar20 - 1));
                        goto LAB_0084c73d;
                      }
                      parse_multilayer_file();
                    }
                    goto LAB_0084c73a;
                  }
                  iVar21 = std::__cxx11::string::compare((char *)&field_name_2);
                  if (iVar21 != 0) break;
                  if (value_2.type_ != kInteger) {
                    if (value_2.type_ == kFloatingPoint) {
                      pcVar30 = "Floating point value found where integer was expected at line %d\n"
                      ;
                    }
                    else {
                      pcVar30 = "No value found where integer was expected at line %d\n";
                    }
                    bVar16 = false;
                    fprintf(_stderr,pcVar30,(ulong)(uint)line_idx);
                    goto LAB_0084c73d;
                  }
                  if (7 < (ulong)value_2.int_value_) {
                    bVar16 = false;
                    fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",
                            value_2.int_value_,0,7);
                    goto LAB_0084c73d;
                  }
                  pLVar5[-1].global_alpha_info.alpha_use_idc = (AlphaUse)value_2.int_value_;
                }
                iVar21 = std::__cxx11::string::compare((char *)&field_name_2);
                max = local_358;
                if (iVar21 == 0) {
LAB_0084c608:
                  bVar16 = anon_unknown_0::ParsedValue::IntegerValueInRange<bool>
                                     (&value_2,(ulong)(uint)line_idx,(int64_t)max,iVar19,pbVar29);
                }
                else {
                  iVar21 = std::__cxx11::string::compare((char *)&field_name_2);
                  if (iVar21 == 0) {
                    min = 8;
                    iVar25 = 0xf;
                    puVar32 = local_338;
                  }
                  else {
                    iVar21 = std::__cxx11::string::compare((char *)&field_name_2);
                    if (iVar21 != 0) {
                      iVar21 = std::__cxx11::string::compare((char *)&field_name_2);
                      max = local_330;
                      if (iVar21 == 0) goto LAB_0084c608;
                      iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                      puVar33 = local_340;
                      if ((iVar19 == 0) ||
                         (iVar19 = std::__cxx11::string::compare((char *)&field_name_2),
                         puVar33 = local_348, iVar19 == 0)) {
                        bVar16 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_short>
                                           (&value_2,0,0xffff,line_idx,puVar33);
                        goto LAB_0084c64c;
                      }
                      iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                      if (iVar19 != 0) {
                        bVar16 = false;
                        fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",
                                field_name_2._M_dataplus._M_p,(ulong)(uint)line_idx);
                        goto LAB_0084c73d;
                      }
                      bVar16 = anon_unknown_0::parse_color_properties
                                         (&file,el._0_4_,&line_idx,(ColorProperties *)&indent_2);
                      if (!bVar16) break;
                      pLVar6 = pLVar5 + -1;
                      (pLVar6->global_alpha_info).alpha_color_description.first.color_range =
                           (bool)(undefined1)indent_2;
                      (pLVar6->global_alpha_info).alpha_color_description.first.color_primaries =
                           indent_2._1_1_;
                      (pLVar6->global_alpha_info).alpha_color_description.first.
                      transfer_characteristics = indent_2._2_1_;
                      (pLVar6->global_alpha_info).alpha_color_description.first.matrix_coefficients
                           = indent_2._3_1_;
                      pLVar5[-1].global_alpha_info.alpha_color_description.second = true;
                      goto LAB_0084c48b;
                    }
                    iVar25 = 3;
                    min = 0;
                    puVar32 = local_328;
                  }
                  bVar16 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
                                     (&value_2,min,iVar25,line_idx,puVar32);
                }
LAB_0084c64c:
              } while (bVar16 != false);
LAB_0084c73a:
              bVar16 = false;
LAB_0084c73d:
              paVar22 = &field_name_2.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)field_name_2._M_dataplus._M_p != paVar22) {
                operator_delete(field_name_2._M_dataplus._M_p);
                paVar22 = extraout_RAX;
              }
              local_358 = (bool *)CONCAT44(local_358._4_4_,
                                           (int)CONCAT71((int7)((ulong)paVar22 >> 8),1));
              goto joined_r0x0084c760;
            }
            iVar20 = std::__cxx11::string::compare((char *)&field_name_1);
            if (iVar20 == 0) {
              iVar20 = indent_1 + 1;
              indent_2 = -1;
              field_name_2._M_dataplus._M_p = (pointer)&field_name_2.field_2;
              field_name_2._M_string_length = 0;
              field_name_2.field_2._M_allocated_capacity =
                   field_name_2.field_2._M_allocated_capacity & 0xffffffffffffff00;
              value_2.type_ = kNone;
              value_2.int_value_ = 0;
              value_2.double_value_ = 0.0;
              pLVar6 = pLVar5 + -1;
              (pLVar6->global_depth_info).z_near.first.sign_flag = false;
              (pLVar6->global_depth_info).z_near.first.exponent = '\0';
              (pLVar6->global_depth_info).z_near.first.mantissa_len = '\0';
              (pLVar6->global_depth_info).z_near.first.field_0x3 = 0;
              (pLVar6->global_depth_info).z_near.first.mantissa = 0;
              pLVar5[-1].global_depth_info.z_near.second = false;
              pLVar6 = pLVar5 + -1;
              (pLVar6->global_depth_info).z_far.first.sign_flag = false;
              (pLVar6->global_depth_info).z_far.first.exponent = '\0';
              (pLVar6->global_depth_info).z_far.first.mantissa_len = '\0';
              (pLVar6->global_depth_info).z_far.first.field_0x3 = 0;
              (pLVar6->global_depth_info).z_far.first.mantissa = 0;
              pLVar5[-1].global_depth_info.z_far.second = false;
              pLVar6 = pLVar5 + -1;
              (pLVar6->global_depth_info).d_min.first.sign_flag = false;
              (pLVar6->global_depth_info).d_min.first.exponent = '\0';
              (pLVar6->global_depth_info).d_min.first.mantissa_len = '\0';
              (pLVar6->global_depth_info).d_min.first.field_0x3 = 0;
              (pLVar6->global_depth_info).d_min.first.mantissa = 0;
              pLVar5[-1].global_depth_info.d_min.second = false;
              pLVar6 = pLVar5 + -1;
              (pLVar6->global_depth_info).d_max.first.sign_flag = false;
              (pLVar6->global_depth_info).d_max.first.exponent = '\0';
              (pLVar6->global_depth_info).d_max.first.mantissa_len = '\0';
              (pLVar6->global_depth_info).d_max.first.field_0x3 = 0;
              (pLVar6->global_depth_info).d_max.first.mantissa = 0;
              pLVar5[-1].global_depth_info.d_max.second = false;
              local_338 = &pLVar5[-1].global_depth_info.depth_representation_type;
              pLVar5[-1].global_depth_info.depth_representation_type = '\0';
              pLVar5[-1].global_depth_info.disparity_ref_view_id = '\0';
              puVar32 = &pLVar5[-1].global_depth_info.disparity_ref_view_id;
LAB_0084bf71:
              do {
                while( true ) {
                  bVar15 = anon_unknown_0::parse_line
                                     (&file,iVar20,false,&indent_2,&has_list_prefix_2,&line_idx,
                                      &field_name_2,&value_2,&syntax_error_1);
                  if (!bVar15) {
                    bVar40 = syntax_error_1 ^ 1;
                    goto LAB_0084c6ae;
                  }
                  iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                  TVar13 = value_2.type_;
                  if (iVar19 != 0) break;
                  if (value_2.type_ == kNone) {
                    parse_multilayer_file((libaom_examples *)&line_idx);
                    puVar31 = local_328;
                  }
                  else {
                    puVar31 = (uint8_t *)value_2.double_value_;
                    if (value_2.type_ != kFloatingPoint) {
                      puVar31 = (uint8_t *)(double)value_2.int_value_;
                    }
                  }
                  if ((TVar13 == kNone) ||
                     (local_328 = puVar31,
                     bVar15 = double_to_depth_representation_element((double)puVar31,&el), !bVar15))
                  {
LAB_0084c811:
                    bVar40 = 0;
                    goto LAB_0084c6ae;
                  }
                  DVar7.mantissa = el.mantissa;
                  DVar7.sign_flag = el.sign_flag;
                  DVar7.exponent = el.exponent;
                  DVar7.mantissa_len = el.mantissa_len;
                  DVar7._3_1_ = el._3_1_;
                  pLVar5[-1].global_depth_info.z_near.first = DVar7;
                  pLVar5[-1].global_depth_info.z_near.second = true;
                }
                iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                TVar13 = value_2.type_;
                if (iVar19 == 0) {
                  if (value_2.type_ == kNone) {
                    parse_multilayer_file((libaom_examples *)&line_idx);
                    pbVar29 = local_330;
                  }
                  else {
                    pbVar29 = (bool *)value_2.double_value_;
                    if (value_2.type_ != kFloatingPoint) {
                      pbVar29 = (bool *)(double)value_2.int_value_;
                    }
                  }
                  if ((TVar13 == kNone) ||
                     (local_330 = pbVar29,
                     bVar15 = double_to_depth_representation_element((double)pbVar29,&el), !bVar15))
                  goto LAB_0084c811;
                  DVar8.mantissa = el.mantissa;
                  DVar8.sign_flag = el.sign_flag;
                  DVar8.exponent = el.exponent;
                  DVar8.mantissa_len = el.mantissa_len;
                  DVar8._3_1_ = el._3_1_;
                  pLVar5[-1].global_depth_info.z_far.first = DVar8;
                  pLVar5[-1].global_depth_info.z_far.second = true;
                  goto LAB_0084bf71;
                }
                iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                TVar13 = value_2.type_;
                if (iVar19 == 0) {
                  if (value_2.type_ == kNone) {
                    parse_multilayer_file((libaom_examples *)&line_idx);
                    puVar33 = local_340;
                  }
                  else {
                    puVar33 = (uint16_t *)value_2.double_value_;
                    if (value_2.type_ != kFloatingPoint) {
                      puVar33 = (uint16_t *)(double)value_2.int_value_;
                    }
                  }
                  if ((TVar13 == kNone) ||
                     (local_340 = puVar33,
                     bVar15 = double_to_depth_representation_element((double)puVar33,&el), !bVar15))
                  goto LAB_0084c811;
                  DVar9.mantissa = el.mantissa;
                  DVar9.sign_flag = el.sign_flag;
                  DVar9.exponent = el.exponent;
                  DVar9.mantissa_len = el.mantissa_len;
                  DVar9._3_1_ = el._3_1_;
                  pLVar5[-1].global_depth_info.d_min.first = DVar9;
                  pLVar5[-1].global_depth_info.d_min.second = true;
                  goto LAB_0084bf71;
                }
                iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                TVar13 = value_2.type_;
                if (iVar19 == 0) {
                  if (value_2.type_ == kNone) {
                    parse_multilayer_file((libaom_examples *)&line_idx);
                    puVar33 = local_348;
                  }
                  else {
                    puVar33 = (uint16_t *)value_2.double_value_;
                    if (value_2.type_ != kFloatingPoint) {
                      puVar33 = (uint16_t *)(double)value_2.int_value_;
                    }
                  }
                  if ((TVar13 == kNone) ||
                     (local_348 = puVar33,
                     bVar15 = double_to_depth_representation_element((double)puVar33,&el), !bVar15))
                  goto LAB_0084c811;
                  DVar10.mantissa = el.mantissa;
                  DVar10.sign_flag = el.sign_flag;
                  DVar10.exponent = el.exponent;
                  DVar10.mantissa_len = el.mantissa_len;
                  DVar10._3_1_ = el._3_1_;
                  pLVar5[-1].global_depth_info.d_max.first = DVar10;
                  pLVar5[-1].global_depth_info.d_max.second = true;
                  goto LAB_0084bf71;
                }
                iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                if (iVar19 == 0) {
                  iVar25 = 0xf;
                  puVar31 = local_338;
                }
                else {
                  iVar19 = std::__cxx11::string::compare((char *)&field_name_2);
                  if (iVar19 != 0) {
                    bVar40 = 0;
                    fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",
                            field_name_2._M_dataplus._M_p,(ulong)(uint)line_idx);
                    break;
                  }
                  iVar25 = 3;
                  puVar31 = puVar32;
                }
                bVar40 = 0;
                bVar15 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
                                   (&value_2,0,iVar25,line_idx,puVar31);
              } while (bVar15);
LAB_0084c6ae:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)field_name_2._M_dataplus._M_p != &field_name_2.field_2) {
                operator_delete(field_name_2._M_dataplus._M_p);
              }
              if (bVar40 != 0) {
                if ((pLVar5[-1].global_depth_info.d_min.second == false) &&
                   (pLVar5[-1].global_depth_info.d_max.second != true)) {
                  bVar15 = true;
                }
                else {
                  this = (libaom_examples *)
                         (((long)(multilayer->layers).
                                 super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(multilayer->layers).
                                 super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 2) *
                         -0x70a3d70a3d70a3d7);
                  if (this + -1 == (libaom_examples *)(ulong)*puVar32) {
                    parse_multilayer_file(this);
                    bVar15 = true;
                    goto LAB_0084c2b8;
                  }
                  bVar15 = true;
                }
                goto LAB_0084c7f8;
              }
              bVar15 = true;
              bVar16 = false;
            }
            else {
              bVar16 = false;
              fprintf(_stderr,"Error: Unknown field %s at line %d\n",field_name_1._M_dataplus._M_p,
                      (ulong)(uint)line_idx);
            }
          }
        }
LAB_0084c7fb:
      } while (bVar16);
      bVar15 = false;
LAB_0084c9c5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field_name_1._M_dataplus._M_p != &field_name_1.field_2) {
        operator_delete(field_name_1._M_dataplus._M_p);
      }
    } while (bVar15);
    bVar41 = 0;
LAB_0084ca1c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)field_name._M_dataplus._M_p != &field_name.field_2) {
      operator_delete(field_name._M_dataplus._M_p);
    }
    if (bVar41 != 0) {
      pLVar5 = (multilayer->layers).
               super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar6 = (multilayer->layers).
               super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pLVar5 != pLVar6) {
        uVar23 = ((long)pLVar6 - (long)pLVar5 >> 2) * -0x70a3d70a3d70a3d7;
        if (uVar23 < 5) {
          pLVar11 = pLVar5;
          do {
            pLVar35 = pLVar11 + 1;
            bVar15 = false;
            if (pLVar11->layer_view_type != pLVar5->layer_view_type) break;
            pLVar11 = pLVar35;
            bVar15 = true;
          } while (pLVar35 != pLVar6);
          bVar16 = (int)uVar23 < 1;
          if (0 < (int)uVar23) {
            MVar3 = multilayer->use_case;
            pbVar29 = &(pLVar5->layer_color_description).second;
            uVar39 = 0;
            do {
              if (MVar3 < (MULTILAYER_USE_CASE_444|MULTILAYER_USE_CASE_GLOBAL_DEPTH)) {
                if ((0xce6U >> (MVar3 & 0x1f) & 1) != 0) {
                  uVar38 = (ulong)*(uint *)(pbVar29 + -8);
                  if (*(uint *)(pbVar29 + -8) == 2) {
                    if ((MVar3 < (MULTILAYER_USE_CASE_444|MULTILAYER_USE_CASE_GLOBAL_DEPTH)) &&
                       ((0x3c1eU >> (MVar3 & 0x1f) & 1) != 0)) goto LAB_0084caf4;
                    goto LAB_0084cafe;
                  }
                  pcVar30 = 
                  "Error: for use_case %d, all layers must have scope %d, found %d instead for layer %d (zero-based index)\n"
                  ;
                  uVar27 = (ulong)MVar3;
                  uVar23 = 2;
LAB_0084cd0a:
                  bVar16 = false;
                  fprintf(_stderr,pcVar30,uVar27,uVar23,uVar38,uVar39 & 0xffffffff);
                  goto LAB_0084cbe3;
                }
                if ((0x3018U >> (MVar3 & 0x1f) & 1) == 0) goto LAB_0084cafe;
LAB_0084caf4:
                if (!bVar15) {
                  bVar16 = false;
                  fprintf(_stderr,
                          "Error: for use_case %d, all layers must have the same view type, found different view_type for layer %d (zero-based index)\n"
                          ,(ulong)MVar3,uVar39 & 0xffffffff);
                  goto LAB_0084cbe3;
                }
              }
LAB_0084cafe:
              uVar4 = *(uint *)(pbVar29 + -0x18);
              if (uVar4 != 0) {
                switch(MVar3) {
                case MULTILAYER_USE_CASE_GLOBAL_ALPHA:
                case MULTILAYER_USE_CASE_ALPHA:
                case MULTILAYER_USE_CASE_STEREO_GLOBAL_ALPHA:
                case MULTILAYER_USE_CASE_STEREO_ALPHA:
                  if ((uVar4 | 4) != 5) {
                    uVar26 = 5;
LAB_0084cd85:
                    uVar23 = (ulong)MVar3;
                    pcVar30 = 
                    "Error: for use_case %d, all layers must be of type %d or %d, found %d for layer %d (zero-based index)\n"
                    ;
                    uVar34 = 1;
                    uVar38 = (ulong)uVar4;
LAB_0084cd8c:
                    bVar16 = false;
                    fprintf(_stderr,pcVar30,uVar23,uVar34,uVar26,uVar38,uVar39);
                    goto LAB_0084cbe3;
                  }
                  break;
                case MULTILAYER_USE_CASE_GLOBAL_DEPTH:
                case MULTILAYER_USE_CASE_DEPTH:
                case MULTILAYER_USE_CASE_STEREO_GLOBAL_DEPTH:
                case MULTILAYER_USE_CASE_STEREO_DEPTH:
                  if ((uVar4 != 1) && (uVar4 != 6)) {
                    uVar26 = 6;
                    goto LAB_0084cd85;
                  }
                  break;
                case MULTILAYER_USE_CASE_STEREO:
                  if (uVar4 != 1) {
                    pcVar30 = 
                    "Error: for use_case %d, all layers must be of type %d, found %d for layer %d (zero-based index)\n"
                    ;
                    uVar27 = 5;
                    uVar23 = 1;
                    uVar38 = (ulong)uVar4;
                    goto LAB_0084cd0a;
                  }
                  break;
                case MULTILAYER_USE_CASE_444_GLOBAL_ALPHA:
                  if (3 < uVar4 - 2) {
                    uVar26 = 10;
                    uVar34 = 2;
                    uVar36 = 3;
                    uVar37 = 4;
                    uVar42 = 5;
LAB_0084ce9c:
                    bVar16 = false;
                    fprintf(_stderr,
                            "Error: for use_case %d, all layers must be of type %d, %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                            ,uVar26,uVar34,uVar36,uVar37,uVar42,(ulong)uVar4,uVar39);
                    goto LAB_0084cbe3;
                  }
                  break;
                case MULTILAYER_USE_CASE_444_GLOBAL_DEPTH:
                  if ((2 < uVar4 - 2) && (uVar4 != 6)) {
                    uVar26 = 0xb;
                    uVar34 = 2;
                    uVar36 = 3;
                    uVar37 = 4;
                    uVar42 = 6;
                    goto LAB_0084ce9c;
                  }
                  break;
                case MULTILAYER_USE_CASE_444:
                  if (2 < uVar4 - 2) {
                    pcVar30 = 
                    "Error: for use_case %d, all layers must be of type %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                    ;
                    uVar23 = 0xc;
                    uVar34 = 2;
                    uVar26 = 3;
                    uVar38 = 4;
                    uVar39 = (ulong)uVar4;
                    goto LAB_0084cd8c;
                  }
                  break;
                case MULTILAYER_USE_CASE_420_444:
                  if (4 < uVar4) {
                    uVar26 = 0xd;
                    uVar34 = 1;
                    uVar36 = 2;
                    uVar37 = 3;
                    uVar42 = 4;
                    goto LAB_0084ce9c;
                  }
                }
              }
              uVar38 = (ulong)pbVar29[-0xb];
              iVar18 = 1 << ((byte)uVar39 & 0x1f);
              if (iVar18 <= (int)(uint)pbVar29[-0xb]) {
                pcVar30 = 
                "Error: layer_dependency_idc of layer %d (zero-based index) must be in [0, %d], found %d for layer %d (zero-based index)\n"
                ;
                uVar27 = uVar39 & 0xffffffff;
                uVar23 = (ulong)(iVar18 - 1);
                goto LAB_0084cd0a;
              }
              if ((uVar4 - 5 < 2) && (*pbVar29 == true)) {
                pcVar30 = 
                "Error: alpha or depth layers cannot have layer_color_description for layer %d (zero-based index)\n"
                ;
                uVar23 = uVar39 & 0xffffffff;
                goto LAB_0084cd2f;
              }
              uVar39 = uVar39 + 1;
              pbVar29 = pbVar29 + 100;
            } while (uVar23 - uVar39 != 0);
            bVar16 = true;
          }
        }
        else {
          pcVar30 = "Error: Too many layers, found %d, max 4\n";
LAB_0084cd2f:
          bVar16 = false;
          fprintf(_stderr,pcVar30,uVar23);
        }
        goto LAB_0084cbe3;
      }
      parse_multilayer_file();
    }
    bVar16 = false;
  }
LAB_0084cbe3:
  std::ifstream::~ifstream(&file);
  return bVar16;
}

Assistant:

bool parse_multilayer_file(const char *metadata_path,
                           MultilayerMetadata *multilayer) {
  std::ifstream file(metadata_path);
  if (!file.is_open()) {
    fprintf(stderr, "Error: Failed to open %s\n", metadata_path);
    return false;
  }

  if (!parse_multilayer_metadata(file, multilayer) ||
      !validate_multilayer_metadata(*multilayer)) {
    return false;
  }
  return multilayer;
}